

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::peer_connection::can_read(peer_connection *this)

{
  bool bVar1;
  value_type *pvVar2;
  byte local_59;
  bitfield_flag local_31;
  undefined4 local_30;
  undefined1 local_29;
  undefined1 local_28 [7];
  bool bw_limit;
  shared_ptr<libtorrent::aux::torrent> t;
  peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  local_29 = 0 < this->m_quota[1];
  if ((bool)local_29) {
    if (0 < this->m_outstanding_bytes) {
      pvVar2 = container_wrapper<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_long,_std::array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>_>
               ::operator[](&this->m_channel_state,1);
      local_31 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                             )pvVar2->m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                             )'\x10');
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_31);
      if (bVar1) {
        this_local._7_1_ = false;
        goto LAB_00455a1f;
      }
    }
    local_59 = 0;
    if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0) {
      local_59 = (this->super_peer_connection_hot_members).field_0x28 & 1 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_59 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00455a1f:
  local_30 = 1;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return this_local._7_1_;
}

Assistant:

bool peer_connection::can_read()
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();

		bool bw_limit = m_quota[download_channel] > 0;

		if (!bw_limit) return false;

		if (m_outstanding_bytes > 0)
		{
			// if we're expecting to download piece data, we might not
			// want to read from the socket in case we're out of disk
			// cache space right now

			if (m_channel_state[download_channel] & peer_info::bw_disk) return false;
		}

		return !m_connecting && !m_disconnecting;
	}